

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aegis256.cc
# Opt level: O0

int aegis_256_open_gather
              (uint8_t *key,uint8_t *out,uint8_t *nonce,size_t nonce_len,uint8_t *in,size_t in_len,
              uint8_t *in_tag,size_t in_tag_len,uint8_t *ad,size_t ad_len,size_t tag_len)

{
  int iVar1;
  ulong in_RCX;
  uint8_t *in_RDX;
  long in_RSI;
  uint8_t *in_RDI;
  long in_R8;
  ulong in_R9;
  uint8_t tag [16];
  aegis_256_state state;
  uint8_t auStack_140 [24];
  long local_128;
  uint8_t local_120 [16];
  uint8_t local_110 [16];
  longlong local_100 [15];
  ulong local_88;
  long local_80;
  long local_68;
  int local_54;
  
  if (in_RCX < 0x21) {
    if (in_tag == (uint8_t *)ad_len) {
      local_88 = in_R9;
      local_80 = in_R8;
      local_68 = in_RSI;
      aegis_256_state_init(in_RDI,in_RDX,in_RCX,(aes_block_t *)local_100);
      for (local_128 = 0; (uint8_t *)(local_128 + 0x10U) <= ad; local_128 = local_128 + 0x10) {
        aead_aegis_256_enc(local_120,(uint8_t *)(in_tag_len + local_128),(aes_block_t *)local_100);
      }
      if (((ulong)ad & 0xf) != 0) {
        OPENSSL_memset(local_110,0,0x10);
        OPENSSL_memcpy(local_110,(void *)(in_tag_len + local_128),(ulong)ad & 0xf);
        aead_aegis_256_enc(local_120,local_110,(aes_block_t *)local_100);
      }
      for (local_128 = 0; local_128 + 0x10U <= local_88; local_128 = local_128 + 0x10) {
        aead_aegis_256_dec((uint8_t *)(local_68 + local_128),(uint8_t *)(local_80 + local_128),
                           (aes_block_t *)local_100);
      }
      if ((local_88 & 0xf) != 0) {
        aegis_256_dec_partial
                  (local_120,(uint8_t *)(local_68 + local_128),(uint8_t *)(local_80 + local_128),
                   local_88 & 0xf,(aes_block_t *)local_100);
      }
      aead_aegis_256_tag(auStack_140,(size_t)ad,local_88,(aes_block_t *)local_100);
      OPENSSL_memset(local_100,0,0x60);
      OPENSSL_memset(local_120,0,0x10);
      iVar1 = CRYPTO_memcmp(auStack_140,(void *)tag._8_8_,ad_len);
      if (iVar1 == 0) {
        local_54 = 1;
      }
      else {
        ERR_put_error(0x1e,0,0x65,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_aegis256.cc"
                      ,0x15a);
        local_54 = 0;
      }
    }
    else {
      ERR_put_error(0x1e,0,0x65,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_aegis256.cc"
                    ,0x13a);
      local_54 = 0;
    }
  }
  else {
    ERR_put_error(0x1e,0,0x79,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_aegis256.cc"
                  ,0x136);
    local_54 = 0;
  }
  return local_54;
}

Assistant:

static int aegis_256_open_gather(const uint8_t *key, uint8_t *out,
                                 const uint8_t *nonce, size_t nonce_len,
                                 const uint8_t *in, size_t in_len,
                                 const uint8_t *in_tag, size_t in_tag_len,
                                 const uint8_t *ad, size_t ad_len,
                                 size_t tag_len) {
  if (nonce_len > AEGIS_256_NONCE_LEN) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_UNSUPPORTED_NONCE_SIZE);
    return 0;
  }
  if (in_tag_len != tag_len) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_BAD_DECRYPT);
    return 0;
  }

  alignas(64) aegis_256_state state;
  aegis_256_state_init(key, nonce, nonce_len, state);

  alignas(16) uint8_t src[16];
  alignas(16) uint8_t dst[16];
  size_t i;
  for (i = 0; i + 16U <= ad_len; i += 16U) {
    aead_aegis_256_enc(dst, ad + i, state);
  }
  if (ad_len & 15) {
    OPENSSL_memset(src, 0, 16);
    OPENSSL_memcpy(src, ad + i, ad_len & 15);
    aead_aegis_256_enc(dst, src, state);
  }
  for (i = 0; i + 16 <= in_len; i += 16) {
    aead_aegis_256_dec(out + i, in + i, state);
  }
  if (in_len & 15) {
    aegis_256_dec_partial(dst, out + i, in + i, in_len & 15, state);
  }

  uint8_t tag[AEGIS_256_TAG_LEN];
  aead_aegis_256_tag(tag, ad_len, in_len, state);

  OPENSSL_memset(state, 0, sizeof state);
  OPENSSL_memset(dst, 0, sizeof src);

  if (CRYPTO_memcmp(tag, in_tag, tag_len) != 0) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_BAD_DECRYPT);
    return 0;
  }

  return 1;
}